

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  Expr *p;
  int iVar1;
  CollSeq *pCVar2;
  char *pcVar3;
  long lVar4;
  
  if ((-1 < iCons) && (iCons < pIdxInfo->nConstraint)) {
    iVar1 = pIdxInfo->aConstraint[(uint)iCons].iTermOffset;
    for (lVar4 = *(long *)(pIdxInfo + 1); *(int *)(lVar4 + 0x14) <= iVar1;
        lVar4 = *(long *)(lVar4 + 8)) {
      iVar1 = iVar1 - *(int *)(lVar4 + 0x14);
    }
    p = *(Expr **)(*(long *)(lVar4 + 0x20) + (long)iVar1 * 0x38);
    if (p->pLeft == (Expr *)0x0) {
      pCVar2 = (CollSeq *)0x0;
    }
    else {
      pCVar2 = sqlite3ExprCompareCollSeq((Parse *)pIdxInfo[1].aConstraint,p);
    }
    if (pCVar2 == (CollSeq *)0x0) {
      pcVar3 = "BINARY";
    }
    else {
      pcVar3 = pCVar2->zName;
    }
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = termFromWhereClause(pHidden->pWC, iTerm)->pExpr;
    if( pX->pLeft ){
      pC = sqlite3ExprCompareCollSeq(pHidden->pParse, pX);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}